

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O0

AbstractionResult *
Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>
          (Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           *param_1,undefined8 param_2,undefined8 *param_3,undefined8 *param_4,undefined4 param_5)

{
  TermSpec sort;
  anon_class_8_1_898ab903 f_00;
  TermSpec elem;
  TermList t;
  TermList t_00;
  TermList t_01;
  anon_class_8_1_898ab903 p;
  TermSpec val;
  anon_class_16_2_ef36fe0a p_00;
  TermSpec args_1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:119:60),_Kernel::TermSpec>_>
  it;
  TermSpec args_2;
  TermSpec args_1_00;
  UnificationConstraint constr_00;
  UnificationConstraint constr_01;
  TermSpec outer;
  bool bVar1;
  uint uVar2;
  TermSpec *pTVar3;
  TermList *pTVar4;
  unsigned_long uVar6;
  size_t sVar7;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppVar8;
  Stack<Kernel::TermSpec> *this;
  unsigned_long *puVar9;
  Elem n;
  int iVar10;
  TermSpec TVar11;
  TermSpec t1;
  TermSpec t1_00;
  TermSpec t2;
  TermSpec t2_00;
  uint f;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *x;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *__end0_2;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *__begin0_2;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *__range2;
  anon_class_56_7_29367afc curSumCanUnify;
  Numeral curSum;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  curNegSummands;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  curPosSummands;
  uint curF;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  constr;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  unify;
  Elem i_1;
  StlIter __end0_1;
  StlIter __begin0_1;
  IterTraits<Lib::RangeIterator<unsigned_long>_> *__range7;
  RationalConstantType num_1;
  TermSpec *var_1;
  anon_class_16_2_625a7563 rest;
  TermSpec *var;
  RationalConstantType num;
  Option<unsigned_long> idx;
  TermSpec *next;
  TermSpec next_;
  Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> todo;
  Elem i;
  StlIter __end0;
  StlIter __begin0;
  IterTraits<Lib::RangeIterator<unsigned_long>_> *__range5;
  Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  shieldedVars;
  anon_class_16_2_6c5ac959 toConstr;
  anon_class_16_2_0971476b sum;
  unsigned_long nVars;
  TermSpec nf;
  TermSpec dt;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *diff;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  _diff;
  TermSpec s1_1;
  TermSpec s1;
  anon_class_8_1_ba1d7831 constraint;
  anon_class_8_1_3fcf64f2 cTerm;
  anon_class_8_1_15ee404b equalIf;
  Option<Kernel::UnificationConstraint> sortsUnif;
  AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_> sig;
  undefined4 in_stack_fffffffffffff488;
  undefined4 in_stack_fffffffffffff48c;
  undefined4 in_stack_fffffffffffff490;
  undefined4 uVar12;
  int in_stack_fffffffffffff494;
  undefined4 uVar13;
  RationalConstantType *this_00;
  undefined4 in_stack_fffffffffffff498;
  int in_stack_fffffffffffff49c;
  undefined4 in_stack_fffffffffffff4a0;
  undefined4 in_stack_fffffffffffff4a4;
  undefined4 in_stack_fffffffffffff4a8;
  uint in_stack_fffffffffffff4ac;
  undefined4 in_stack_fffffffffffff4b0;
  undefined4 in_stack_fffffffffffff4b4;
  undefined4 in_stack_fffffffffffff4b8;
  uint in_stack_fffffffffffff4bc;
  TermSpec *in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c8;
  int in_stack_fffffffffffff4cc;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *in_stack_fffffffffffff4d0;
  TermList in_stack_fffffffffffff4d8;
  undefined8 in_stack_fffffffffffff4e0;
  EqualIf *in_stack_fffffffffffff4e8;
  EqualIf *b;
  Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
  *in_stack_fffffffffffff4f0;
  Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf> *this_01;
  EqualIf *in_stack_fffffffffffff508;
  undefined8 in_stack_fffffffffffff520;
  undefined4 in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff52c;
  undefined8 in_stack_fffffffffffff530;
  undefined8 in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff544;
  undefined8 in_stack_fffffffffffff548;
  AbstractingUnifier *in_stack_fffffffffffff570;
  TermList in_stack_fffffffffffff578;
  undefined8 in_stack_fffffffffffff580;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *pSVar14;
  TermList in_stack_fffffffffffff5d8;
  Stack<Kernel::TermSpec> *in_stack_fffffffffffff5e0;
  undefined7 in_stack_fffffffffffff5e8;
  undefined1 in_stack_fffffffffffff5ef;
  undefined4 in_stack_fffffffffffff648;
  undefined1 local_8e0 [88];
  anon_class_56_7_29367afc *in_stack_fffffffffffff778;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *local_7f0;
  uint local_764;
  undefined8 uStack_738;
  undefined1 local_670 [24];
  undefined1 *local_658;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *local_630;
  undefined1 *local_628;
  RationalConstantType *pRStack_620;
  undefined1 **local_618;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppStack_610;
  undefined8 **local_608;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> **ppSStack_600;
  undefined1 *local_5f8;
  RationalConstantType *pRStack_5f0;
  undefined1 **local_5e8;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppStack_5e0;
  undefined8 **local_5d8;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> **ppSStack_5d0;
  undefined1 local_5c0 [32];
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *local_5a0;
  undefined1 *local_598;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *local_590;
  undefined1 local_588 [32];
  undefined1 *local_568;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *local_560;
  undefined1 local_540 [40];
  uint64_t local_518;
  undefined8 uStack_510;
  TermSpec *local_500;
  uint64_t local_4f8;
  int local_4f0;
  uint64_t local_4e8;
  int local_4e0;
  uint64_t local_4d8;
  undefined8 uStack_4d0;
  Elem local_4b8;
  undefined1 local_480 [24];
  undefined1 *local_468;
  undefined1 local_460 [168];
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_&>_>
  local_3b8;
  undefined1 **local_398;
  undefined8 **local_390;
  undefined8 *local_388;
  undefined1 *local_380;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *local_378;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *local_370;
  unsigned_long local_340;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *local_338;
  undefined4 local_328;
  undefined4 uStack_324;
  int iStack_320;
  undefined4 uStack_31c;
  uint64_t local_318;
  int local_310;
  uint64_t local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  int iStack_2f0;
  undefined4 uStack_2ec;
  uint64_t local_2e8;
  int local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  uint64_t local_2c8;
  int local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  uint64_t local_2a8;
  int local_2a0;
  uint64_t local_298;
  int iStack_290;
  undefined4 uStack_28c;
  Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *local_288;
  uint64_t local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  uint64_t local_250;
  undefined1 local_248 [12];
  uint64_t local_238;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  UnificationConstraint local_220 [2];
  uint64_t local_1b8;
  int local_1b0;
  uint64_t local_1a8;
  int local_1a0;
  TermList local_198;
  undefined8 uStack_190;
  int local_180;
  uint64_t local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  uint64_t local_160;
  undefined1 local_158 [12];
  uint64_t local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  UnificationConstraint local_130 [2];
  uint64_t local_c8;
  int local_c0;
  uint64_t local_b8;
  int local_b0;
  TermList local_a8;
  undefined8 uStack_a0;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined1 local_68 [59];
  undefined1 local_2d;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 local_18;
  Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf> *local_8;
  TermList TVar5;
  
  local_2c = param_5;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_8 = param_1;
  Lib::Option<Kernel::UnificationConstraint>::Option
            ((Option<Kernel::UnificationConstraint> *)0xa0e5d7);
  local_78 = local_18;
  local_80 = &local_2d;
  local_70 = local_68;
  bVar1 = TermSpec::isTerm((TermSpec *)0xa0e614);
  if (bVar1) {
    AbstractingUnifier::subs((AbstractingUnifier *)0xa0e63a);
    TVar11 = TermSpec::sort((TermSpec *)
                            CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
    local_c8 = (uint64_t)TVar11.term._content;
    local_c0 = TVar11.index;
    local_b8 = local_c8;
    local_b0 = local_c0;
    pTVar3 = RobSubstitution::derefBound
                       ((RobSubstitution *)
                        CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                        in_stack_fffffffffffff4c0);
    local_a8._content = (pTVar3->term)._content;
    uStack_a0 = *(undefined8 *)&pTVar3->index;
    bVar1 = TermSpec::isVar((TermSpec *)0xa0e6dd);
    if (bVar1) {
      local_148 = local_a8._content;
      uStack_140 = (undefined4)uStack_a0;
      uStack_13c = (undefined4)((ulong)uStack_a0 >> 0x20);
      pTVar4 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::sort();
      local_160 = pTVar4->_content;
      TVar5._content._4_4_ = in_stack_fffffffffffff4a4;
      TVar5._content._0_4_ = in_stack_fffffffffffff4a0;
      TermSpec::TermSpec((TermSpec *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                         TVar5,in_stack_fffffffffffff494);
      local_178 = (uint64_t)AtomicSort::superSort();
      t._content._4_4_ = in_stack_fffffffffffff4a4;
      t._content._0_4_ = in_stack_fffffffffffff4a0;
      TermSpec::TermSpec((TermSpec *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),t
                         ,in_stack_fffffffffffff494);
      t1.index = uStack_140;
      t1.term._content = local_148;
      in_stack_fffffffffffff488 = (undefined4)local_170;
      in_stack_fffffffffffff48c = (undefined4)((ulong)local_170 >> 0x20);
      in_stack_fffffffffffff490 = (undefined4)uStack_168;
      in_stack_fffffffffffff494 = (int)((ulong)uStack_168 >> 0x20);
      TVar11.index = in_stack_fffffffffffff490;
      TVar11.term._content = local_170;
      TVar11._12_4_ = in_stack_fffffffffffff494;
      t1._12_4_ = 0;
      t2._12_4_ = 0;
      t2.term._content = local_158._0_8_;
      t2.index = local_158._8_4_;
      UnificationConstraint::UnificationConstraint(local_130,t1,t2,TVar11);
      Lib::some<Kernel::UnificationConstraint>
                ((UnificationConstraint *)
                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      Lib::Option<Kernel::UnificationConstraint>::operator=
                ((Option<Kernel::UnificationConstraint> *)
                 CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                 (Option<Kernel::UnificationConstraint> *)
                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      Lib::Option<Kernel::UnificationConstraint>::~Option
                ((Option<Kernel::UnificationConstraint> *)0xa0e7f0);
    }
    else {
      pTVar4 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::sort();
      bVar1 = TermList::operator!=(&local_a8,pTVar4);
      if (bVar1) {
        Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
        Coproduct<Kernel::AbstractionOracle::NeverEqual,_0>(param_1);
        local_180 = 1;
        goto LAB_00a10160;
      }
    }
  }
  bVar1 = TermSpec::isTerm((TermSpec *)0xa0e89e);
  if (bVar1) {
    AbstractingUnifier::subs((AbstractingUnifier *)0xa0e8c4);
    TVar11 = TermSpec::sort((TermSpec *)
                            CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
    local_1b8 = (uint64_t)TVar11.term._content;
    local_1b0 = TVar11.index;
    local_1a8 = local_1b8;
    local_1a0 = local_1b0;
    pTVar3 = RobSubstitution::derefBound
                       ((RobSubstitution *)
                        CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                        in_stack_fffffffffffff4c0);
    local_198._content = (pTVar3->term)._content;
    uStack_190 = *(undefined8 *)&pTVar3->index;
    bVar1 = TermSpec::isVar((TermSpec *)0xa0e967);
    if (bVar1) {
      local_238 = local_198._content;
      uStack_230 = (undefined4)uStack_190;
      uStack_22c = (undefined4)((ulong)uStack_190 >> 0x20);
      pTVar4 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::sort();
      local_250 = pTVar4->_content;
      t_00._content._4_4_ = in_stack_fffffffffffff4a4;
      t_00._content._0_4_ = in_stack_fffffffffffff4a0;
      TermSpec::TermSpec((TermSpec *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                         t_00,in_stack_fffffffffffff494);
      local_268 = (uint64_t)AtomicSort::superSort();
      t_01._content._4_4_ = in_stack_fffffffffffff4a4;
      t_01._content._0_4_ = in_stack_fffffffffffff4a0;
      TermSpec::TermSpec((TermSpec *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                         t_01,in_stack_fffffffffffff494);
      t1_00.index = uStack_230;
      t1_00.term._content = local_238;
      in_stack_fffffffffffff488 = (undefined4)local_260;
      in_stack_fffffffffffff48c = (undefined4)((ulong)local_260 >> 0x20);
      in_stack_fffffffffffff490 = (undefined4)uStack_258;
      in_stack_fffffffffffff494 = (int)((ulong)uStack_258 >> 0x20);
      sort.index = in_stack_fffffffffffff490;
      sort.term._content = local_260;
      sort._12_4_ = in_stack_fffffffffffff494;
      t1_00._12_4_ = 0;
      t2_00._12_4_ = 0;
      t2_00.term._content = local_248._0_8_;
      t2_00.index = local_248._8_4_;
      UnificationConstraint::UnificationConstraint(local_220,t1_00,t2_00,sort);
      Lib::some<Kernel::UnificationConstraint>
                ((UnificationConstraint *)
                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      Lib::Option<Kernel::UnificationConstraint>::operator=
                ((Option<Kernel::UnificationConstraint> *)
                 CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                 (Option<Kernel::UnificationConstraint> *)
                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      Lib::Option<Kernel::UnificationConstraint>::~Option
                ((Option<Kernel::UnificationConstraint> *)0xa0ea7a);
    }
    else {
      pTVar4 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::sort();
      bVar1 = TermList::operator!=(&local_198,pTVar4);
      if (bVar1) {
        Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
        Coproduct<Kernel::AbstractionOracle::NeverEqual,_0>(param_1);
        local_180 = 1;
        goto LAB_00a10160;
      }
    }
  }
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
  local_288 = Lib::
              Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              ::operator*((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0xa0eb1e);
  AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::addF();
  AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::minusF();
  local_2b8 = *local_20;
  uStack_2b0 = local_20[1];
  args_1.term._content._4_4_ = in_stack_fffffffffffff4bc;
  args_1.term._content._0_4_ = in_stack_fffffffffffff4b8;
  args_1._8_8_ = in_stack_fffffffffffff4c0;
  TVar11 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
           ::{lambda((auto:1)...)#1}::operator()
                     ((anon_class_8_1_3fcf64f2 *)
                      CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
                      in_stack_fffffffffffff4ac,args_1);
  TVar5 = TVar11.term._content;
  iVar10 = TVar11.index;
  local_2d8 = *local_28;
  uStack_2d0 = local_28[1];
  args_1_00._8_8_ = in_stack_fffffffffffff4e0;
  args_1_00.term._content = in_stack_fffffffffffff4d8._content;
  args_2.term._content._4_4_ = in_stack_fffffffffffff4cc;
  args_2.term._content._0_4_ = in_stack_fffffffffffff4c8;
  args_2._8_8_ = in_stack_fffffffffffff4d0;
  local_2c8 = TVar5._content;
  local_2c0 = iVar10;
  local_2a8 = TVar5._content;
  local_2a0 = iVar10;
  TVar11 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
           ::{lambda((auto:1)...)#1}::operator()
                     ((anon_class_8_1_3fcf64f2 *)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc
                      ,args_1_00,args_2);
  local_308 = (uint64_t)TVar11.term._content;
  local_2e0 = TVar11.index;
  uStack_300 = CONCAT44(uStack_28c,local_2e0);
  outer._8_8_ = in_stack_fffffffffffff580;
  outer.term._content = in_stack_fffffffffffff578._content;
  local_2e8 = local_308;
  local_298 = local_308;
  iStack_290 = local_2e0;
  TVar11 = norm(outer,in_stack_fffffffffffff570);
  local_318 = (uint64_t)TVar11.term._content;
  iStack_320 = TVar11.index;
  local_2f8._0_4_ = (undefined4)TVar11.term._content;
  local_2f8._4_4_ = TVar11.term._content._4_4_;
  local_328 = (undefined4)local_2f8;
  uStack_324 = local_2f8._4_4_;
  uStack_31c = uStack_2ec;
  local_338 = local_288;
  local_310 = iStack_320;
  local_2f8 = local_318;
  iStack_2f0 = iStack_320;
  iterAtoms<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1,auto:2)_2_>
            (local_318,iStack_320,local_18,local_288);
  Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::size(local_288);
  Lib::$_0::operator()
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4cc,
             (unsigned_long)in_stack_fffffffffffff4c0);
  local_370 = local_288;
  p.diff._4_4_ = in_stack_fffffffffffff4ac;
  p.diff._0_4_ = in_stack_fffffffffffff4a8;
  Lib::IterTraits<Lib::RangeIterator<unsigned_long>>::
  find<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1)_1_>
            ((IterTraits<Lib::RangeIterator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),p);
  local_378 = local_288;
  f_00.diff._4_4_ = in_stack_fffffffffffff49c;
  f_00.diff._0_4_ = in_stack_fffffffffffff498;
  uVar6 = Lib::Option<unsigned_long>::
          unwrapOrElse<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda()_2_>
                    ((Option<unsigned_long> *)
                     CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),f_00);
  Lib::Option<unsigned_long>::~Option((Option<unsigned_long> *)0xa0edbc);
  local_388 = &local_78;
  local_380 = &local_2d;
  local_398 = &local_80;
  local_390 = &local_388;
  local_340 = uVar6;
  Lib::arrayIter<Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>>
            ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
             CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0));
  bVar1 = Lib::
          IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>,unsigned_long>(Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>&,unsigned_long)::{lambda(auto:1)#1},std::pair<Kernel::TermSpec,Kernel::RationalConstantType>&>>
          ::
          any<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1&)_2_>
                    (&local_3b8);
  if (bVar1) {
    alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_8_1_15ee404b::operator()
              ((anon_class_8_1_15ee404b *)in_stack_fffffffffffff578._content);
    alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
    ::{lambda(auto:1&)#1}::operator()
              ((anon_class_16_2_6c5ac959 *)TVar5._content,
               (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
               CONCAT44(iVar10,in_stack_fffffffffffff648));
    uVar12 = (undefined4)local_460._56_8_;
    uVar13 = SUB84(local_460._56_8_,4);
    constr_00._t1.index = in_stack_fffffffffffff528;
    constr_00._t1.term._content = in_stack_fffffffffffff520;
    constr_00._t1._12_4_ = in_stack_fffffffffffff52c;
    constr_00._t2.term._content = in_stack_fffffffffffff530;
    constr_00._t2._8_8_ = in_stack_fffffffffffff538;
    constr_00._sort.term._content._0_4_ = in_stack_fffffffffffff540;
    constr_00._sort.term._content._4_4_ = in_stack_fffffffffffff544;
    constr_00._sort._8_8_ = in_stack_fffffffffffff548;
    AbstractionOracle::EqualIf::constr<>(in_stack_fffffffffffff508,constr_00);
    Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
    Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
              (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    AbstractionOracle::EqualIf::~EqualIf((EqualIf *)CONCAT44(uVar13,uVar12));
    AbstractionOracle::EqualIf::~EqualIf((EqualIf *)CONCAT44(uVar13,uVar12));
    local_180 = 1;
  }
  else {
    sVar7 = Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::size(local_288);
    if (sVar7 == 0) {
      alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_8_1_15ee404b::operator()
                ((anon_class_8_1_15ee404b *)in_stack_fffffffffffff578._content);
      Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
      Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
                (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
      AbstractionOracle::EqualIf::~EqualIf
                ((EqualIf *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
      local_180 = 1;
    }
    else if (local_340 == 0) {
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
      Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::operator[]
                (local_288,0);
      local_764 = TermSpec::functor((TermSpec *)0xa0fb27);
      Lib::
      Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
      Lib::
      Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
      RationalConstantType::RationalConstantType
                ((RationalConstantType *)
                 CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                 in_stack_fffffffffffff49c);
      pSVar14 = local_288;
      local_7f0 = Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::begin
                            (local_288);
      ppVar8 = Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::end(pSVar14);
      for (; local_7f0 != ppVar8; local_7f0 = local_7f0 + 1) {
        AbstractingUnifier::subs((AbstractingUnifier *)0xa0fc4a);
        RobSubstitution::derefBound
                  ((RobSubstitution *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                   in_stack_fffffffffffff4c0);
        uVar2 = TermSpec::functor((TermSpec *)0xa0fc80);
        if (uVar2 != local_764) {
          bVar1 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_56_7_29367afc
                  ::operator()(in_stack_fffffffffffff778);
          if (!bVar1) {
            Lib::
            Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
            Coproduct<Kernel::AbstractionOracle::NeverEqual,_0>(param_1);
            goto LAB_00a100bc;
          }
          RationalConstantType::RationalConstantType
                    ((RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                     in_stack_fffffffffffff49c);
          RationalConstantType::operator=
                    ((RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                     (RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
          RationalConstantType::~RationalConstantType
                    ((RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
          Lib::
          Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator->((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0xa0fdbe);
          Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::reset
                    ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                     CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
          Lib::
          Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator->((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0xa0fde2);
          Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::reset
                    ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                     CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
          local_764 = uVar2;
        }
        RationalConstantType::operator+=
                  ((RationalConstantType *)in_stack_fffffffffffff4d0,
                   (RationalConstantType *)
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
        RationalConstantType::isPositive((RationalConstantType *)0xa0fe4d);
        Lib::
        Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::operator->((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)0xa0fe94);
        std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>::pair
                  ((pair<Kernel::TermSpec,_Kernel::RationalConstantType> *)
                   CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                   (pair<Kernel::TermSpec,_Kernel::RationalConstantType> *)
                   CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::push
                  ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                   CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                   (pair<Kernel::TermSpec,_Kernel::RationalConstantType> *)
                   CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
        std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>::~pair
                  ((pair<Kernel::TermSpec,_Kernel::RationalConstantType> *)0xa0fed3);
      }
      bVar1 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_56_7_29367afc::
              operator()(in_stack_fffffffffffff778);
      if (bVar1) {
        alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_8_1_15ee404b::
        operator()((anon_class_8_1_15ee404b *)in_stack_fffffffffffff578._content);
        this_01 = (Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                   *)(local_8e0 + 0x10);
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                   (Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        AbstractionOracle::EqualIf::unify
                  ((EqualIf *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                   (Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0));
        b = (EqualIf *)local_8e0;
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                   (Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
        AbstractionOracle::EqualIf::constr
                  ((EqualIf *)CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),
                   (Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0));
        Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
        Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(this_01,b);
        AbstractionOracle::EqualIf::~EqualIf
                  ((EqualIf *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)in_stack_fffffffffffff4d0);
        AbstractionOracle::EqualIf::~EqualIf
                  ((EqualIf *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
        Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)in_stack_fffffffffffff4d0);
        AbstractionOracle::EqualIf::~EqualIf
                  ((EqualIf *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
      }
      else {
        Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
        Coproduct<Kernel::AbstractionOracle::NeverEqual,_0>(param_1);
      }
LAB_00a100bc:
      local_180 = 1;
      RationalConstantType::~RationalConstantType
                ((RationalConstantType *)
                 CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
      Lib::
      Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffff4d0);
      Lib::
      Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffff4d0);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffff4d0);
      Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffff4d0);
    }
    else {
      Lib::
      Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
      Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::size(local_288);
      Lib::$_0::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff4d0,
                 CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                 (unsigned_long)in_stack_fffffffffffff4c0);
      local_468 = local_480;
      Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::begin
                ((IterTraits<Lib::RangeIterator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::end
                ((IterTraits<Lib::RangeIterator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
      while (bVar1 = Lib::operator!=((StlIter *)
                                     CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),
                                     (StlIter *)
                                     CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488)),
            bVar1) {
        local_4b8 = Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::operator*
                              ((StlIter *)0xa0f152);
        Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        Recycled((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
        Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0xa0f188);
        ppVar8 = Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::operator[]
                           (local_288,local_4b8);
        local_4d8 = (ppVar8->first).term._content;
        uStack_4d0 = *(undefined8 *)&(ppVar8->first).index;
        elem.term._content._4_4_ = in_stack_fffffffffffff49c;
        elem.term._content._0_4_ = in_stack_fffffffffffff498;
        elem.index = in_stack_fffffffffffff4a0;
        elem._12_4_ = in_stack_fffffffffffff4a4;
        Lib::Stack<Kernel::TermSpec>::push
                  ((Stack<Kernel::TermSpec> *)
                   CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490),elem);
        while( true ) {
          this = Lib::
                 Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 ::operator->((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                               *)0xa0f1df);
          in_stack_fffffffffffff5ef = Lib::Stack<Kernel::TermSpec>::isNonEmpty(this);
          if (!(bool)in_stack_fffffffffffff5ef) break;
          in_stack_fffffffffffff5e0 =
               Lib::
               Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
               operator->((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                           *)0xa0f21c);
          TVar11 = Lib::Stack<Kernel::TermSpec>::pop(in_stack_fffffffffffff5e0);
          in_stack_fffffffffffff5d8 = TVar11.term._content;
          local_4f0 = TVar11.index;
          local_4f8 = in_stack_fffffffffffff5d8._content;
          local_4e8 = in_stack_fffffffffffff5d8._content;
          local_4e0 = local_4f0;
          AbstractingUnifier::subs((AbstractingUnifier *)0xa0f28d);
          local_500 = RobSubstitution::derefBound
                                ((RobSubstitution *)
                                 CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                                 in_stack_fffffffffffff4c0);
          bVar1 = TermSpec::isVar((TermSpec *)0xa0f2d3);
          if (bVar1) {
            Lib::
            Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            ::operator->((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0xa0f2f6);
            local_518 = (local_500->term)._content;
            uStack_510 = *(undefined8 *)&local_500->index;
            val.term._content._4_4_ = in_stack_fffffffffffff4ac;
            val.term._content._0_4_ = in_stack_fffffffffffff4a8;
            val.index = in_stack_fffffffffffff4b0;
            val._12_4_ = in_stack_fffffffffffff4b4;
            Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),val);
          }
          else {
            Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            ::operator->((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0xa0f363);
            TermSpec::termArgs(in_stack_fffffffffffff4c0);
            in_stack_fffffffffffff498 = (undefined4)local_540._32_8_;
            in_stack_fffffffffffff49c = SUB84(local_540._32_8_,4);
            in_stack_fffffffffffff488 = (undefined4)local_540._16_8_;
            in_stack_fffffffffffff48c = SUB84(local_540._16_8_,4);
            in_stack_fffffffffffff490 = (undefined4)local_540._24_8_;
            in_stack_fffffffffffff494 = SUB84(local_540._24_8_,4);
            it._iter._inner._next = in_stack_fffffffffffff4c8;
            it._iter._func.this = in_stack_fffffffffffff4c0;
            it._iter._inner._from = in_stack_fffffffffffff4cc;
            it._iter._16_8_ = in_stack_fffffffffffff4d0;
            Lib::Stack<Kernel::TermSpec>::
            loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::TermSpec::termArgs()const::_lambda(auto:1)_1_,Kernel::TermSpec>>>
                      ((Stack<Kernel::TermSpec> *)
                       CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),it);
          }
        }
        Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffff4d0);
        Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::operator++
                  ((StlIter *)CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0));
      }
      local_180 = 2;
      Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::~StlIter((StlIter *)0xa0f0e8);
      Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::~StlIter((StlIter *)0xa0f0f5);
      Lib::$_0::operator()
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4cc,
                 (unsigned_long)in_stack_fffffffffffff4c0);
      local_568 = local_460;
      local_560 = local_288;
      p_00.shieldedVars._4_4_ = in_stack_fffffffffffff4b4;
      p_00.shieldedVars._0_4_ = in_stack_fffffffffffff4b0;
      p_00.diff._0_4_ = in_stack_fffffffffffff4b8;
      p_00.diff._4_4_ = in_stack_fffffffffffff4bc;
      Lib::IterTraits<Lib::RangeIterator<unsigned_long>>::
      find<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1)_3_>
                ((IterTraits<Lib::RangeIterator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8),p_00);
      bVar1 = Lib::Option::operator_cast_to_bool((Option<unsigned_long> *)0xa0f468);
      pSVar14 = local_288;
      if (bVar1) {
        puVar9 = Lib::Option<unsigned_long>::operator*((Option<unsigned_long> *)0xa0f49e);
        Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::operator[]
                  (pSVar14,*puVar9);
        RationalConstantType::RationalConstantType
                  ((RationalConstantType *)
                   CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                   (RationalConstantType *)
                   CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
        pSVar14 = local_288;
        puVar9 = Lib::Option<unsigned_long>::operator*((Option<unsigned_long> *)0xa0f4f3);
        in_stack_fffffffffffff4d0 =
             Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::operator[]
                       (pSVar14,*puVar9);
        local_5a0 = local_288;
        local_598 = local_540;
        local_628 = local_588;
        pRStack_620 = (RationalConstantType *)&local_70;
        local_618 = &local_80;
        local_608 = &local_388;
        ppSStack_600 = &local_5a0;
        ppStack_610 = in_stack_fffffffffffff4d0;
        local_5f8 = local_628;
        pRStack_5f0 = pRStack_620;
        local_5e8 = local_618;
        ppStack_5e0 = in_stack_fffffffffffff4d0;
        local_5d8 = local_608;
        ppSStack_5d0 = ppSStack_600;
        local_590 = in_stack_fffffffffffff4d0;
        this_00 = pRStack_620;
        ifIntTraits<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1)_4_,Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1)_5_,Kernel::NumTraits<Kernel::RationalConstantType>>
                  (local_5c0);
        Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
        Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
                  (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
        AbstractionOracle::EqualIf::~EqualIf((EqualIf *)this_00);
        local_180 = 1;
        RationalConstantType::~RationalConstantType(this_00);
      }
      else {
        if (local_340 == 1) {
          in_stack_fffffffffffff578._content = 0;
          local_630 = Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::
                      operator[](local_288,0);
          Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::operator[]
                    (local_288,in_stack_fffffffffffff578._content);
          RationalConstantType::RationalConstantType
                    ((RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),
                     (RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
          Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::size(local_288);
          Lib::$_0::operator()
                    ((anon_class_1_0_00000001 *)in_stack_fffffffffffff4d0,
                     CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                     (unsigned_long)in_stack_fffffffffffff4c0);
          local_658 = local_670;
          Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::begin
                    ((IterTraits<Lib::RangeIterator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
          Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::end
                    ((IterTraits<Lib::RangeIterator<unsigned_long>_> *)
                     CONCAT44(in_stack_fffffffffffff48c,in_stack_fffffffffffff488));
          while (bVar1 = Lib::operator!=((StlIter *)
                                         CONCAT44(in_stack_fffffffffffff494,
                                                  in_stack_fffffffffffff490),
                                         (StlIter *)
                                         CONCAT44(in_stack_fffffffffffff48c,
                                                  in_stack_fffffffffffff488)), bVar1) {
            n = Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::operator*
                          ((StlIter *)0xa0f84a);
            in_stack_fffffffffffff548 = local_18;
            TermSpec::varSpec((TermSpec *)
                              CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
            Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::operator[]
                      (local_288,n);
            bVar1 = uncanellableOccursCheck
                              ((AbstractingUnifier *)
                               CONCAT17(in_stack_fffffffffffff5ef,in_stack_fffffffffffff5e8),
                               (VarSpec *)in_stack_fffffffffffff5e0,
                               (TermSpec *)in_stack_fffffffffffff5d8._content);
            in_stack_fffffffffffff544 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff544);
            if (bVar1) {
              Lib::
              Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
              Coproduct<Kernel::AbstractionOracle::NeverEqual,_0>(param_1);
              local_180 = 1;
              goto LAB_00a0f943;
            }
            Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::operator++
                      ((StlIter *)CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0));
          }
          local_180 = 6;
LAB_00a0f943:
          Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::~StlIter
                    ((StlIter *)0xa0f950);
          Lib::IterTraits<Lib::RangeIterator<unsigned_long>_>::StlIter::~StlIter
                    ((StlIter *)0xa0f95d);
          if (local_180 == 6) {
            local_180 = 0;
          }
          RationalConstantType::~RationalConstantType
                    ((RationalConstantType *)
                     CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
          if (local_180 != 0) goto LAB_00a0faae;
        }
        alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_8_1_15ee404b::
        operator()((anon_class_8_1_15ee404b *)in_stack_fffffffffffff578._content);
        alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
        ::{lambda(auto:1&)#1}::operator()
                  ((anon_class_16_2_6c5ac959 *)TVar5._content,
                   (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                   CONCAT44(iVar10,in_stack_fffffffffffff648));
        uVar12 = (undefined4)uStack_738;
        uVar13 = (undefined4)((ulong)uStack_738 >> 0x20);
        constr_01._t1.index = in_stack_fffffffffffff528;
        constr_01._t1.term._content = in_stack_fffffffffffff520;
        constr_01._t1._12_4_ = in_stack_fffffffffffff52c;
        constr_01._t2.term._content = in_stack_fffffffffffff530;
        constr_01._t2._8_8_ = in_stack_fffffffffffff538;
        constr_01._sort.term._content._0_4_ = in_stack_fffffffffffff540;
        constr_01._sort.term._content._4_4_ = in_stack_fffffffffffff544;
        constr_01._sort._8_8_ = in_stack_fffffffffffff548;
        AbstractionOracle::EqualIf::constr<>(in_stack_fffffffffffff508,constr_01);
        Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
        Coproduct<Kernel::AbstractionOracle::EqualIf,_0>
                  (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
        AbstractionOracle::EqualIf::~EqualIf((EqualIf *)CONCAT44(uVar13,uVar12));
        AbstractionOracle::EqualIf::~EqualIf((EqualIf *)CONCAT44(uVar13,uVar12));
        local_180 = 1;
      }
LAB_00a0faae:
      Lib::Option<unsigned_long>::~Option((Option<unsigned_long> *)0xa0fabb);
      Lib::
      Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)in_stack_fffffffffffff4d0);
    }
  }
  Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)in_stack_fffffffffffff4d0);
LAB_00a10160:
  Lib::Option<Kernel::UnificationConstraint>::~Option
            ((Option<Kernel::UnificationConstraint> *)0xa1016d);
  return param_1;
}

Assistant:

AbstractionOracle::AbstractionResult alasca(AbstractingUnifier& au, TermSpec const& t1, TermSpec const& t2, NumTraits n_, Options::UnificationWithAbstraction uwa) {
  TIME_TRACE("unification with abstraction ALASCA")
  AlascaSignature<NumTraits> sig;
  Option<UnificationConstraint> sortsUnif;
  auto equalIf = [&]() {
    if (sortsUnif.isSome()) {
      return AbstractionOracle::EqualIf()
                     .unify(*sortsUnif.take());
    } else {
      return AbstractionOracle::EqualIf();
    }
  };
  using AbstractionResult = AbstractionOracle::AbstractionResult;
  using NeverEqual = AbstractionOracle::NeverEqual;
  using Numeral = typename NumTraits::ConstantType;
  
  auto cTerm = [&](auto... args) { return au.subs().createTerm(args...); };
  auto constraint = [&](auto lhs, auto rhs) { return UnificationConstraint(lhs, rhs, TermSpec(sig.sort(), 0)); };

#define CHECK_SORTS(t1, t2)                                                               \
  if (t1.isTerm()) {                                                                      \
    auto s1 = au.subs().derefBound(t1.sort());                                            \
    if (s1.isVar()) {                                                                     \
      ASS(sortsUnif.isNone())                                                             \
      sortsUnif = some(UnificationConstraint(s1, TermSpec(sig.sort(), 0), TermSpec(AtomicSort::superSort(), 0))); \
    } else if (s1.term != sig.sort()) {                                                   \
      return AbstractionResult(NeverEqual{});                                             \
    }                                                                                     \
  }                                                                                       \

  CHECK_SORTS(t1, t2)
  CHECK_SORTS(t2, t1)

  Recycled<Stack<std::pair<TermSpec, Numeral>>> _diff;
  auto& diff = *_diff;
  // TODO prevent these cterm calls?
  auto dt = cTerm(sig.addF(), cTerm(sig.minusF(), t1), t2);
  auto nf = norm(std::move(dt), au);

  iterAtoms(std::move(nf), au, sig,
    [&diff](auto t, auto num) { diff.push(std::make_pair(t,  num)); });

  // TODO bin search if many elems
  auto nVars = range(0, diff.size())
    .find([&](auto i) { return !diff[i].first.isVar();  })
    .unwrapOrElse([&](){ return diff.size(); });

  ASS(nVars == 0 || diff[nVars - 1].first.isVar())
  ASS(nVars == diff.size() || !diff[nVars].first.isVar())

  auto sum = [&](auto iter) -> TermSpec {
      return iterTraits(std::move(iter))
        .map([&](auto x) { return numMul(x.second, std::move(x.first)); })
        .fold([&](auto l, auto r) 
          { return cTerm(sig.addF(), std::move(l), std::move(r)); })
        .unwrapOrElse([&]() { return TermSpec(sig.numeralTl(Numeral(0)), 0); }); };

  auto toConstr = [&](auto& stack) {
    return constraint(
              sum(arrayIter(stack)
                 .filter([](auto& x) { return x.second.isPositive(); })
                 .map([](auto& x) { return std::make_pair(std::move(std::move(x.first)), x.second); })),
              sum(arrayIter(stack)
                 .filter([](auto& x) { return !x.second.isPositive(); })
                 .map([](auto& x) { return std::make_pair(std::move(x.first), -x.second); })));
  };

  if (arrayIter(diff).any([&](auto& x) 
        { return x.first.isTerm() && NumTraits::isMul(x.first.functor()); })) {

    // non-linear multiplication. we cannot deal with this in alasca
    return AbstractionResult(equalIf().constr(toConstr(diff)));

  } else if (diff.size() == 0) {
    return AbstractionResult(equalIf());

  } else if (nVars > 0) {
     Recycled<DHSet<TermSpec>> shieldedVars;
     for (auto i : range(nVars, diff.size())) {
       Recycled<Stack<TermSpec>> todo;
       todo->push(diff[i].first);
       while (todo->isNonEmpty()) {
         auto next_ = todo->pop();
         auto& next = au.subs().derefBound(next_);
         if (next.isVar()) {
           shieldedVars->insert(next);
         } else {
           todo->loadFromIterator(next.termArgs());
         }
       }
     }
     auto idx = 
       range(0, nVars)
          .find([&](auto i) 
                { return !shieldedVars->contains(diff[i].first); });

    if (idx) {
      // we have a variable unshielded in this unification
      auto num = diff[*idx].second;
      auto& var = diff[*idx].first;
      auto rest = [&]() 
      { return range(0, diff.size())
                .filter([&](auto i) { return i != *idx; })
                .map([&](auto i) { return std::move(diff[i]); }); };

      return AbstractionResult(ifIntTraits(NumTraits{}, 
            // TODO
            [&](auto n) { return num == -1 ? equalIf().unify(constraint(std::move(var), sum(rest())))
                               : num ==  1 ? equalIf().unify(constraint(std::move(var), sum(rest().map([](auto x) { return std::make_pair(std::move(x.first), -std::move(x.second)); }))))
                               :                      equalIf().constr(constraint(numMul(-num, std::move(var)), sum(rest())))
                                                    ; },
            [&](auto n) { return equalIf().unify(constraint(std::move(var), 
                sum(rest().map([&](auto x) { return std::make_pair(std::move(x.first), divOrPanic(n, x.second, -num)); })
                  ))); }
            ));

    } else {
      // all variables are shielded

      if (nVars == 1) {
       auto& var = diff[0].first;
       auto  num = diff[0].second;

       for (auto i : range(nVars, diff.size())) {
         if (uncanellableOccursCheck(au, var.varSpec(), diff[i].first)) {
           return AbstractionResult(NeverEqual{});
         }
       }
     }
     return AbstractionResult(equalIf().constr(toConstr(diff)));
    }
  } 

  // no variables

  Recycled<Stack<UnificationConstraint>> unify;
  Recycled<Stack<UnificationConstraint>> constr;
  auto curF = diff[0].first.functor();
  Recycled<Stack<std::pair<TermSpec, Numeral>>> curPosSummands;
  Recycled<Stack<std::pair<TermSpec, Numeral>>> curNegSummands;
  auto curSum = Numeral(0);  


  auto curSumCanUnify = [&]() -> bool {
      if (curSum != Numeral(0)) {
        return false;

      } else if (curNegSummands->size() == 1) {
        for (auto& s : *curPosSummands) {
          unify->push(UnificationConstraint(
            (*curNegSummands)[0].first,
            std::move(s.first), 
            TermSpec(sig.sort(), 0)));
        }
        return true;

      } else if (curPosSummands->size() == 1) {
        for (auto& s : *curNegSummands) {
          unify->push(UnificationConstraint(
            (*curPosSummands)[0].first,
            std::move(s.first),
            TermSpec(sig.sort(), 0)));
        }
        return true;

      } else {
        ASS(curPosSummands->size() + curNegSummands->size() >= 3)
        constr->push(UnificationConstraint(
              sum(arrayIter(*curPosSummands)
                 .map([](auto& x) { return std::make_pair(std::move(x.first), x.second); })),
              sum(arrayIter(*curNegSummands)
                 .map([](auto& x) { return std::make_pair(std::move(x.first), -x.second); })),
              TermSpec(sig.sort(), 0)));
        return true;
      }
  };

  for (auto& x : diff) {
    auto f = au.subs().derefBound(x.first).functor();
    if (f != curF) {
      if (!curSumCanUnify()) { return AbstractionResult(NeverEqual{});}
      curF = f;
      curSum = Numeral(0);
      curPosSummands->reset();
      curNegSummands->reset();
    }
    curSum += x.second;
    (x.second.isPositive() ? curPosSummands : curNegSummands)->push(std::move(x));
  }
  if (!curSumCanUnify()) { return AbstractionResult(NeverEqual{});}
  return AbstractionResult(equalIf().unify(std::move(unify)).constr(std::move(constr)));
}